

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  
  pTVar2 = index2adr(L,idx);
  iVar1 = lj_tab_next(L,(GCtab *)(ulong)(pTVar2->u32).lo,L->top + -1);
  if (iVar1 == 0) {
    L->top = L->top + -1;
  }
  else {
    pTVar2 = L->top + 1;
    L->top = pTVar2;
    if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar2) {
      lj_state_growstack1(L);
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_next(lua_State *L, int idx)
{
  cTValue *t = index2adr(L, idx);
  int more;
  lj_checkapi(tvistab(t), "stack slot %d is not a table", idx);
  more = lj_tab_next(L, tabV(t), L->top-1);
  if (more) {
    incr_top(L);  /* Return new key and value slot. */
  } else {  /* End of traversal. */
    L->top--;  /* Remove key slot. */
  }
  return more;
}